

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O2

Data128 Centaurus::pack_charclass(CharClass<wchar_t> *cc)

{
  int index;
  int i;
  long lVar1;
  Data128 d128;
  undefined1 auStack_38 [18];
  short asStack_26 [7];
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    index = (int)cc;
    CharClass<wchar_t>::operator[]((CharClass<wchar_t> *)auStack_38,index);
    if (auStack_38._8_4_ == auStack_38._12_4_) {
      (asStack_26 + lVar1 * 2 + -1)[0] = -1;
      (asStack_26 + lVar1 * 2 + -1)[1] = 0;
    }
    else {
      CharClass<wchar_t>::operator[]((CharClass<wchar_t> *)auStack_38,index);
      asStack_26[lVar1 * 2 + -1] = auStack_38._8_2_;
      CharClass<wchar_t>::operator[]((CharClass<wchar_t> *)auStack_38,index);
      asStack_26[lVar1 * 2] = (short)auStack_38._12_4_ + -1;
    }
  }
  return stack0xffffffffffffffd8;
}

Assistant:

static asmjit::Data128 pack_charclass(const CharClass<wchar_t>& cc)
{
    asmjit::Data128 d128;

    for (int i = 0; i < 4; i++)
    {
        if (cc[i].empty())
        {
            d128.uw[i * 2 + 0] = 0xFFFF;
            d128.uw[i * 2 + 1] = 0;
        }
        else
        {
            d128.uw[i * 2 + 0] = cc[i].start();
            d128.uw[i * 2 + 1] = cc[i].end() - 1;
        }
    }

    return d128;
}